

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O1

bool __thiscall
Lib::DArray<Lib::ArrayMapEntry<unsigned_int>_>::ensure
          (DArray<Lib::ArrayMapEntry<unsigned_int>_> *this,size_t s)

{
  long lVar1;
  ulong uVar2;
  ArrayMapEntry<unsigned_int> *pAVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ArrayMapEntry<unsigned_int> *pAVar7;
  ulong uVar8;
  ulong uVar9;
  ArrayMapEntry<unsigned_int> *res;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar13 [16];
  
  uVar2 = this->_capacity;
  if (uVar2 < s) {
    uVar9 = uVar2 * 2;
    if (uVar2 * 2 <= s) {
      uVar9 = s;
    }
    uVar8 = uVar9 * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar8 == 0) {
      pAVar7 = (ArrayMapEntry<unsigned_int> *)
               FixedSizeAllocator<8UL>::alloc
                         ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar8 < 0x11) {
      pAVar7 = (ArrayMapEntry<unsigned_int> *)
               FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar8 < 0x19) {
      pAVar7 = (ArrayMapEntry<unsigned_int> *)
               FixedSizeAllocator<24UL>::alloc
                         ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar8 < 0x21) {
      pAVar7 = (ArrayMapEntry<unsigned_int> *)
               FixedSizeAllocator<32UL>::alloc
                         ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar8 < 0x31) {
      pAVar7 = (ArrayMapEntry<unsigned_int> *)
               FixedSizeAllocator<48UL>::alloc
                         ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar8 < 0x41) {
      pAVar7 = (ArrayMapEntry<unsigned_int> *)
               FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      pAVar7 = (ArrayMapEntry<unsigned_int> *)::operator_new(uVar8,0x10);
    }
    auVar6 = _DAT_00871040;
    auVar5 = _DAT_00871030;
    auVar4 = _DAT_00871020;
    lVar1 = uVar9 - 1;
    auVar10._8_4_ = (int)lVar1;
    auVar10._0_8_ = lVar1;
    auVar10._12_4_ = (int)((ulong)lVar1 >> 0x20);
    uVar8 = 0;
    auVar10 = auVar10 ^ _DAT_00871040;
    do {
      auVar12._8_4_ = (int)uVar8;
      auVar12._0_8_ = uVar8;
      auVar12._12_4_ = (int)(uVar8 >> 0x20);
      auVar13 = (auVar12 | auVar5) ^ auVar6;
      iVar11 = auVar10._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar11 && auVar10._0_4_ < auVar13._0_4_ ||
                  iVar11 < auVar13._4_4_) & 1)) {
        pAVar7[uVar8]._timestamp = 0;
      }
      if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
          auVar13._12_4_ <= auVar10._12_4_) {
        pAVar7[uVar8 + 1]._timestamp = 0;
      }
      auVar12 = (auVar12 | auVar4) ^ auVar6;
      iVar14 = auVar12._4_4_;
      if (iVar14 <= iVar11 && (iVar14 != iVar11 || auVar12._0_4_ <= auVar10._0_4_)) {
        pAVar7[uVar8 + 2]._timestamp = 0;
        pAVar7[uVar8 + 3]._timestamp = 0;
      }
      uVar8 = uVar8 + 4;
    } while ((uVar9 + 3 & 0xfffffffffffffffc) != uVar8);
    pAVar3 = this->_array;
    if (pAVar3 != (ArrayMapEntry<unsigned_int> *)0x0) {
      uVar8 = this->_capacity * 8 + 0xf & 0xfffffffffffffff0;
      if (uVar8 == 0) {
        pAVar3->_obj = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
        pAVar3->_timestamp = GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pAVar3;
      }
      else if (uVar8 < 0x11) {
        pAVar3->_obj = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
        pAVar3->_timestamp = GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pAVar3;
      }
      else if (uVar8 < 0x19) {
        pAVar3->_obj = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
        pAVar3->_timestamp = GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pAVar3;
      }
      else if (uVar8 < 0x21) {
        pAVar3->_obj = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
        pAVar3->_timestamp = GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pAVar3;
      }
      else if (uVar8 < 0x31) {
        pAVar3->_obj = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
        pAVar3->_timestamp = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pAVar3;
      }
      else if (uVar8 < 0x41) {
        pAVar3->_obj = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
        pAVar3->_timestamp = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pAVar3;
      }
      else {
        operator_delete(pAVar3,0x10);
      }
    }
    this->_size = s;
    this->_capacity = uVar9;
    this->_array = pAVar7;
  }
  else {
    this->_size = s;
  }
  return s <= uVar2;
}

Assistant:

inline bool ensure(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return true;
    }

    size_t newCapacity = std::max(s, _capacity*2);

    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");
    C* newArray=array_new<C>(mem, newCapacity);

    if(_array) {
      array_delete(_array, _capacity);
      DEALLOC_KNOWN(_array,sizeof(C)*_capacity,"DArray<>");
    }
    _size = s;
    _capacity = newCapacity;
    _array = newArray;
    return false;
  }